

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_TestShell::
TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_TestShell
          (TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_TestShell
           *this)

{
  TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_TestShell
  *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &
       PTR__TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_TestShell_0032edf8
  ;
  return;
}

Assistant:

TEST(MemoryReporterPlugin, whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed)
{
    mock("formatter").expectOneCall("report_test_start").withParameter("result", result).withParameter("test", test);
    mock("formatter").expectOneCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").expectOneCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(*test, *result);
    char *memory = getCurrentMallocAllocator()->allocMemoryLeakNode(100);
    getCurrentMallocAllocator()->free_memory(memory, 100, "unknown", 1);
}